

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallProjectViaInstallScript
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  reference pbVar6;
  allocator local_b79;
  int res;
  allocator local_b51;
  string local_b50;
  string local_b30 [32];
  undefined1 local_b10 [8];
  ostringstream cmCPackLog_msg_5;
  string local_998 [32];
  undefined1 local_978 [8];
  ostringstream cmCPackLog_msg_4;
  allocator local_7f9;
  string local_7f8;
  string local_7d8 [32];
  undefined1 local_7b8 [8];
  ostringstream cmCPackLog_msg_3;
  string local_640 [32];
  undefined1 local_620 [8];
  ostringstream cmCPackLog_msg_2;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  string local_430 [8];
  string dir;
  undefined1 local_3f0 [8];
  ostringstream cmCPackLog_msg_1;
  string local_278 [8];
  string installScript;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  iterator it;
  string local_238;
  undefined1 local_218 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeScriptsVector;
  ostringstream local_1e0 [8];
  ostringstream cmCPackLog_msg;
  allocator local_51;
  string local_50;
  char *local_30;
  char *cmakeScripts;
  string *tempInstallDirectory_local;
  cmCPackGenerator *pcStack_18;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  cmakeScripts = (char *)tempInstallDirectory;
  tempInstallDirectory_local._7_1_ = setDestDir;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CPACK_INSTALL_SCRIPT",&local_51);
  pcVar4 = GetOption(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    local_30 = pcVar4;
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar5 = std::operator<<((ostream *)local_1e0,"- Install scripts: ");
    poVar5 = std::operator<<(poVar5,local_30);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x1e5,pcVar4);
    std::__cxx11::string::~string
              ((string *)
               &cmakeScriptsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_218);
    pcVar4 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,pcVar4,(allocator *)((long)&it._M_current + 7));
    cmSystemTools::ExpandListArgument
              (&local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218,false);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_248);
    local_248._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_218);
    while( true ) {
      installScript.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_218);
      bVar2 = __gnu_cxx::operator!=
                        (&local_248,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&installScript.field_2 + 8));
      if (!bVar2) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_248);
      std::__cxx11::string::string(local_278,(string *)pbVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
      poVar5 = std::operator<<((ostream *)local_3f0,"- Install script: ");
      poVar5 = std::operator<<(poVar5,local_278);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x1f1,pcVar4);
      std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
      if ((tempInstallDirectory_local._7_1_ & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_7f8,"CMAKE_INSTALL_PREFIX",&local_7f9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        SetOption(this,&local_7f8,pcVar4);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_978);
        poVar5 = std::operator<<((ostream *)local_978,
                                 "- Using non-DESTDIR install... (this->SetOption)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x20b,pcVar4);
        std::__cxx11::string::~string(local_998);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_978);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b10);
        poVar5 = std::operator<<((ostream *)local_b10,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar5 = std::operator<<(poVar5,(string *)cmakeScripts);
        poVar5 = std::operator<<(poVar5,"\'");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x20e,pcVar4);
        std::__cxx11::string::~string(local_b30);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b10);
      }
      else {
        std::__cxx11::string::string(local_430);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_450,"CPACK_INSTALL_PREFIX",&local_451);
        pcVar4 = GetOption(this,&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        std::allocator<char>::~allocator((allocator<char> *)&local_451);
        if (pcVar4 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_478,"CPACK_INSTALL_PREFIX",&local_479);
          pcVar4 = GetOption(this,&local_478);
          std::__cxx11::string::operator+=(local_430,pcVar4);
          std::__cxx11::string::~string((string *)&local_478);
          std::allocator<char>::~allocator((allocator<char> *)&local_479);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4a0,"CMAKE_INSTALL_PREFIX",&local_4a1);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        SetOption(this,&local_4a0,pcVar4);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
        poVar5 = std::operator<<((ostream *)local_620,
                                 "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x202,pcVar4);
        std::__cxx11::string::~string(local_640);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7b8);
        poVar5 = std::operator<<((ostream *)local_7b8,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar5 = std::operator<<(poVar5,local_430);
        poVar5 = std::operator<<(poVar5,"\'");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x204,pcVar4);
        std::__cxx11::string::~string(local_7d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7b8);
        std::__cxx11::string::~string(local_430);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b50,"CMAKE_CURRENT_BINARY_DIR",&local_b51);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_b50,pcVar4);
      std::__cxx11::string::~string((string *)&local_b50);
      std::allocator<char>::~allocator((allocator<char> *)&local_b51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&res,"CMAKE_CURRENT_SOURCE_DIR",&local_b79);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,(string *)&res,pcVar4);
      std::__cxx11::string::~string((string *)&res);
      std::allocator<char>::~allocator((allocator<char> *)&local_b79);
      this_00 = this->MakefileMap;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmMakefile::ReadListFile(this_00,pcVar4);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if ((bVar3) || (!bVar2)) {
        this_local._4_4_ = 0;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      std::__cxx11::string::~string(local_278);
      if (bVar2) goto LAB_00481526;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_248);
    }
    bVar2 = false;
LAB_00481526:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_218);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallScript(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  const char* cmakeScripts
    = this->GetOption("CPACK_INSTALL_SCRIPT");
  if ( cmakeScripts && *cmakeScripts )
    {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Install scripts: " << cmakeScripts << std::endl);
    std::vector<std::string> cmakeScriptsVector;
    cmSystemTools::ExpandListArgument(cmakeScripts,
      cmakeScriptsVector);
    std::vector<std::string>::iterator it;
    for ( it = cmakeScriptsVector.begin();
      it != cmakeScriptsVector.end();
      ++it )
      {
      std::string installScript = *it;

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install script: " << installScript << std::endl);

      if ( setDestDir )
        {
        // For DESTDIR based packaging, use the *project* CMAKE_INSTALL_PREFIX
        // underneath the tempInstallDirectory. The value of the project's
        // CMAKE_INSTALL_PREFIX is sent in here as the value of the
        // CPACK_INSTALL_PREFIX variable.

        std::string dir;
        if (this->GetOption("CPACK_INSTALL_PREFIX"))
          {
          dir += this->GetOption("CPACK_INSTALL_PREFIX");
          }
        this->SetOption("CMAKE_INSTALL_PREFIX", dir.c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)"
          << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'" << std::endl);
        }
      else
        {
        this->SetOption("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Using non-DESTDIR install... (this->SetOption)" << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
          << "'" << std::endl);
        }

      this->SetOptionIfNotSet("CMAKE_CURRENT_BINARY_DIR",
        tempInstallDirectory.c_str());
      this->SetOptionIfNotSet("CMAKE_CURRENT_SOURCE_DIR",
        tempInstallDirectory.c_str());
      int res = this->MakefileMap->ReadListFile(installScript.c_str());
      if ( cmSystemTools::GetErrorOccuredFlag() || !res )
        {
        return 0;
        }
      }
    }
  return 1;
}